

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.hxx
# Opt level: O2

ptr<srv_config> __thiscall cornerstone::cluster_config::get_server(cluster_config *this,int id)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  long *plVar2;
  ptr<srv_config> pVar3;
  
  plVar1 = (long *)(CONCAT44(in_register_00000034,id) + 0x10);
  plVar2 = plVar1;
  do {
    plVar2 = (long *)*plVar2;
    if (plVar2 == plVar1) {
      this->log_idx_ = 0;
      this->prev_log_idx_ = 0;
      goto LAB_001415be;
    }
  } while (*(int *)plVar2[2] != (int)in_RDX._M_pi);
  std::__shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2> *)(plVar2 + 2));
  in_RDX._M_pi = extraout_RDX;
LAB_001415be:
  pVar3.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  pVar3.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<srv_config>)
         pVar3.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<srv_config> get_server(int id) const
    {
        for (const_srv_itor it = servers_.begin(); it != servers_.end(); ++it)
        {
            if ((*it)->get_id() == id)
            {
                return *it;
            }
        }

        return ptr<srv_config>();
    }